

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

bool P_Thing_CanRaise(AActor *thing)

{
  FState *pFVar1;
  TFlags<ActorFlag,_unsigned_int> local_74;
  DVector3 local_70;
  TVector2<double> local_58;
  byte local_41;
  double dStack_40;
  bool check;
  double oldradius;
  double oldheight;
  AActor *pAStack_28;
  ActorFlags oldflags;
  AActor *info;
  FState *RaiseState;
  AActor *thing_local;
  
  pFVar1 = AActor::GetRaiseState(thing);
  if (pFVar1 == (FState *)0x0) {
    thing_local._7_1_ = false;
  }
  else {
    pAStack_28 = AActor::GetDefault(thing);
    TFlags<ActorFlag,_unsigned_int>::TFlags
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&oldheight + 4),&thing->flags);
    oldradius = thing->Height;
    dStack_40 = thing->radius;
    TFlags<ActorFlag,_unsigned_int>::operator|=(&thing->flags,MF_SOLID);
    thing->Height = pAStack_28->Height;
    thing->radius = pAStack_28->radius;
    AActor::Pos(&local_70,thing);
    TVector2<double>::TVector2(&local_58,&local_70);
    local_41 = P_CheckPosition(thing,&local_58,false);
    TFlags<ActorFlag,_unsigned_int>::TFlags(&local_74,(Self *)((long)&oldheight + 4));
    TFlags<ActorFlag,_unsigned_int>::operator=(&thing->flags,&local_74);
    thing->radius = dStack_40;
    thing->Height = oldradius;
    if ((local_41 & 1) == 0) {
      thing_local._7_1_ = false;
    }
    else {
      thing_local._7_1_ = true;
    }
  }
  return thing_local._7_1_;
}

Assistant:

bool P_Thing_CanRaise(AActor *thing)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return false;
	}
	
	AActor *info = thing->GetDefault();

	// Check against real height and radius
	ActorFlags oldflags = thing->flags;
	double oldheight = thing->Height;
	double oldradius = thing->radius;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;
	thing->radius = info->radius;

	bool check = P_CheckPosition (thing, thing->Pos());

	// Restore checked properties
	thing->flags = oldflags;
	thing->radius = oldradius;
	thing->Height = oldheight;

	if (!check)
	{
		return false;
	}

	return true;
}